

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O2

istream * __thiscall nivalis::Plotter::import_json(Plotter *this,istream *is,string *error_msg)

{
  vector<nivalis::Function,_std::allocator<nivalis::Function>_> *this_00;
  vector<nivalis::SliderData,_std::allocator<nivalis::SliderData>_> *this_01;
  Environment *this_02;
  int height;
  unsigned_long uVar1;
  value_t vVar2;
  json_value jVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  uint64_t uVar7;
  size_type sVar8;
  reference pvVar9;
  reference pbVar10;
  ostream *poVar11;
  reference pvVar12;
  string *this_03;
  pointer pFVar13;
  size_t i_2;
  long lVar14;
  size_t sVar15;
  ulong uVar16;
  pointer pFVar17;
  size_t i;
  double dVar18;
  initializer_list<nlohmann::detail::json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  init;
  initializer_list_t init_00;
  json j;
  iterator __begin3;
  iterator __end3_2;
  iterator __end3;
  Shell tmpshell;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1d8;
  ostringstream ss;
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_1a8 [10];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (error_msg != (string *)0x0) {
    error_msg->_M_string_length = 0;
    *(error_msg->_M_dataplus)._M_p = '\0';
  }
  this_00 = &this->funcs;
  std::vector<nivalis::Function,_std::allocator<nivalis::Function>_>::clear(this_00);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json(&j,(nullptr_t)0x0);
  nlohmann::operator>>(is,&j);
  if (j.m_type == array) {
    nlohmann::detail::
    json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::json_ref<const_char_(&)[6],_0>
              ((json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                *)&ss,(char (*) [6])0x20c92e);
    nlohmann::detail::
    json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::
    json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&,_0>
              (local_1a8,&j);
    init._M_len = 2;
    init._M_array = (iterator)&ss;
    nlohmann::detail::
    json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::json_ref((json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                *)&__begin3,init);
    init_00._M_len = 1;
    init_00._M_array = (iterator)&__begin3;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::basic_json(&local_1d8,init_00,true,array);
    jVar3 = j.m_value;
    vVar2 = j.m_type;
    j.m_type = local_1d8.m_type;
    local_1d8.m_type = vVar2;
    j.m_value = local_1d8.m_value;
    local_1d8.m_value = jVar3;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json(&local_1d8);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)&__begin3);
    lVar14 = 0x20;
    do {
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)(&ss + lVar14));
      lVar14 = lVar14 + -0x20;
    } while (lVar14 != -0x20);
  }
  this_02 = &this->env;
  Environment::clear(this_02);
  std::__cxx11::string::string<std::allocator<char>>((string *)&ss,"x",(allocator<char> *)&__begin3)
  ;
  uVar7 = Environment::addr_of(this_02,(string *)&ss,false);
  this->x_var = (uint32_t)uVar7;
  std::__cxx11::string::~string((string *)&ss);
  std::__cxx11::string::string<std::allocator<char>>((string *)&ss,"y",(allocator<char> *)&__begin3)
  ;
  uVar7 = Environment::addr_of(this_02,(string *)&ss,false);
  this->y_var = (uint32_t)uVar7;
  std::__cxx11::string::~string((string *)&ss);
  std::__cxx11::string::string<std::allocator<char>>((string *)&ss,"t",(allocator<char> *)&__begin3)
  ;
  uVar7 = Environment::addr_of(this_02,(string *)&ss,false);
  this->t_var = (uint32_t)uVar7;
  std::__cxx11::string::~string((string *)&ss);
  std::__cxx11::string::string<std::allocator<char>>((string *)&ss,"r",(allocator<char> *)&__begin3)
  ;
  uVar7 = Environment::addr_of(this_02,(string *)&ss,false);
  this->r_var = (uint32_t)uVar7;
  std::__cxx11::string::~string((string *)&ss);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
  Shell::Shell(&tmpshell,this_02,(ostream *)&ss);
  sVar8 = nlohmann::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
          ::count<char_const(&)[6]>
                    ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      *)&j,(char (*) [6])"shell");
  if (sVar8 != 0) {
    pvVar9 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         *)&j,"shell");
    if (pvVar9->m_type == array) {
      pvVar9 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                           *)&j,"shell");
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::begin(&__begin3,pvVar9);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::end(&__end3,pvVar9);
      while( true ) {
        bVar4 = nlohmann::detail::
                iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator!=(&__begin3,&__end3);
        if (!bVar4) break;
        pbVar10 = nlohmann::detail::
                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::operator*(&__begin3);
        if (pbVar10->m_type == string) {
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::
          get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_50,pbVar10);
          bVar4 = Shell::eval_line(&tmpshell,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          if (!bVar4) {
            poVar11 = std::operator<<((ostream *)&std::cout,"json_load_err ");
            std::__cxx11::stringbuf::str();
            poVar11 = std::operator<<(poVar11,(string *)&__end3_2);
            std::operator<<(poVar11,"\n");
            std::__cxx11::string::~string((string *)&__end3_2);
          }
        }
        nlohmann::detail::
        iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::operator++(&__begin3);
      }
    }
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
  this->polar_grid = false;
  this->enable_axes = true;
  this->enable_grid = true;
  sVar8 = nlohmann::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
          ::count<char_const(&)[5]>
                    ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      *)&j,(char (*) [5])0x1e2395);
  if (sVar8 != 0) {
    pvVar9 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         *)&j,"view");
    if (pvVar9->m_type == object) {
      sVar8 = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ::count<char_const(&)[5]>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                          *)pvVar9,(char (*) [5])"xmin");
      if (sVar8 != 0) {
        pvVar12 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              *)pvVar9,"xmin");
        dVar18 = nlohmann::
                 basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::get<double,_double,_0>(pvVar12);
        (this->view).xmin = dVar18;
      }
      sVar8 = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ::count<char_const(&)[5]>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                          *)pvVar9,(char (*) [5])"xmax");
      if (sVar8 != 0) {
        pvVar12 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              *)pvVar9,"xmax");
        dVar18 = nlohmann::
                 basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::get<double,_double,_0>(pvVar12);
        (this->view).xmax = dVar18;
      }
      sVar8 = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ::count<char_const(&)[5]>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                          *)pvVar9,(char (*) [5])"xmin");
      if (sVar8 != 0) {
        pvVar12 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              *)pvVar9,"ymin");
        dVar18 = nlohmann::
                 basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::get<double,_double,_0>(pvVar12);
        (this->view).ymin = dVar18;
      }
      sVar8 = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ::count<char_const(&)[5]>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                          *)pvVar9,(char (*) [5])"xmax");
      if (sVar8 != 0) {
        pvVar12 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              *)pvVar9,"ymax");
        dVar18 = nlohmann::
                 basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::get<double,_double,_0>(pvVar12);
        (this->view).ymax = dVar18;
      }
      iVar5 = (this->view).swid;
      height = (this->view).shigh;
      sVar8 = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ::count<char_const(&)[6]>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                          *)pvVar9,(char (*) [6])"width");
      if (sVar8 != 0) {
        pvVar12 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              *)pvVar9,"width");
        dVar18 = nlohmann::
                 basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::get<double,_double,_0>(pvVar12);
        (this->view).swid = (int)dVar18;
      }
      sVar8 = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ::count<char_const(&)[7]>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                          *)pvVar9,(char (*) [7])"height");
      if (sVar8 != 0) {
        pvVar12 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              *)pvVar9,"height");
        dVar18 = nlohmann::
                 basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::get<double,_double,_0>(pvVar12);
        (this->view).shigh = (int)dVar18;
      }
      resize(this,iVar5,height);
      sVar8 = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ::count<char_const(&)[5]>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                          *)pvVar9,(char (*) [5])"axes");
      if (sVar8 != 0) {
        pvVar12 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              *)pvVar9,"axes");
        bVar4 = nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::get<bool,_bool,_0>(pvVar12);
        this->enable_axes = bVar4;
      }
      sVar8 = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ::count<char_const(&)[5]>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                          *)pvVar9,(char (*) [5])0x1e2fbb);
      if (sVar8 != 0) {
        pvVar12 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              *)pvVar9,"grid");
        bVar4 = nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::get<bool,_bool,_0>(pvVar12);
        this->enable_grid = bVar4;
      }
      sVar8 = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ::count<char_const(&)[6]>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                          *)pvVar9,(char (*) [6])0x20e6e7);
      if (sVar8 != 0) {
        pvVar9 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                             *)pvVar9,"polar");
        bVar4 = nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::get<bool,_bool,_0>(pvVar9);
        this->polar_grid = bVar4;
      }
    }
  }
  this_01 = &this->sliders;
  std::vector<nivalis::SliderData,_std::allocator<nivalis::SliderData>_>::clear(this_01);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(this->sliders_vars)._M_t);
  sVar8 = nlohmann::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
          ::count<char_const(&)[8]>
                    ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      *)&j,(char (*) [8])"sliders");
  if (sVar8 != 0) {
    pvVar9 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         *)&j,"sliders");
    if (pvVar9->m_type == array) {
      pvVar9 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                           *)&j,"sliders");
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::begin((iterator *)&ss,pvVar9);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::end(&__begin3,pvVar9);
      while( true ) {
        bVar4 = nlohmann::detail::
                iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator!=((iterator *)&ss,&__begin3);
        if (!bVar4) break;
        pbVar10 = nlohmann::detail::
                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::operator*((iterator *)&ss);
        if (pbVar10->m_type == object) {
          lVar14 = (long)(this->sliders).
                         super__Vector_base<nivalis::SliderData,_std::allocator<nivalis::SliderData>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->sliders).
                         super__Vector_base<nivalis::SliderData,_std::allocator<nivalis::SliderData>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          std::vector<nivalis::SliderData,_std::allocator<nivalis::SliderData>_>::emplace_back<>
                    (this_01);
          sVar8 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::count<char_const(&)[4]>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              *)pbVar10,(char (*) [4])0x1e22d1);
          if (sVar8 != 0) {
            pvVar9 = nlohmann::
                     basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                     ::operator[]<char_const>
                               ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                 *)pbVar10,"min");
            dVar18 = nlohmann::
                     basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     ::get<double,_double,_0>(pvVar9);
            *(float *)((long)(this_01->
                             super__Vector_base<nivalis::SliderData,_std::allocator<nivalis::SliderData>_>
                             )._M_impl.super__Vector_impl_data._M_start + lVar14 + 0x24) =
                 (float)dVar18;
          }
          sVar8 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::count<char_const(&)[4]>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              *)pbVar10,(char (*) [4])0x1e22e6);
          if (sVar8 != 0) {
            pvVar9 = nlohmann::
                     basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                     ::operator[]<char_const>
                               ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                 *)pbVar10,"max");
            dVar18 = nlohmann::
                     basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     ::get<double,_double,_0>(pvVar9);
            *(float *)((long)(this_01->
                             super__Vector_base<nivalis::SliderData,_std::allocator<nivalis::SliderData>_>
                             )._M_impl.super__Vector_impl_data._M_start + lVar14 + 0x28) =
                 (float)dVar18;
          }
          sVar8 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::count<char_const(&)[4]>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              *)pbVar10,(char (*) [4])0x20e9d0);
          if (sVar8 != 0) {
            pvVar9 = nlohmann::
                     basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                     ::operator[]<char_const>
                               ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                 *)pbVar10,"val");
            dVar18 = nlohmann::
                     basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     ::get<double,_double,_0>(pvVar9);
            *(float *)((long)(this_01->
                             super__Vector_base<nivalis::SliderData,_std::allocator<nivalis::SliderData>_>
                             )._M_impl.super__Vector_impl_data._M_start + lVar14 + 0x20) =
                 (float)dVar18;
          }
          sVar8 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::count<char_const(&)[4]>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              *)pbVar10,(char (*) [4])"var");
          if (sVar8 != 0) {
            pvVar9 = nlohmann::
                     basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                     ::operator[]<char_const>
                               ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                 *)pbVar10,"var");
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::
            get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__end3,
                       pvVar9);
            std::__cxx11::string::operator=
                      ((string *)
                       ((long)(this->sliders).
                              super__Vector_base<nivalis::SliderData,_std::allocator<nivalis::SliderData>_>
                              ._M_impl.super__Vector_impl_data._M_start + lVar14),(string *)&__end3)
            ;
            std::__cxx11::string::~string((string *)&__end3);
            update_slider_var(this,lVar14 / 0x58);
            sVar8 = nlohmann::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ::count<char_const(&)[4]>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                *)pbVar10,(char (*) [4])0x20e9d0);
            if (sVar8 == 0) {
              dVar18 = Environment::get(this_02,(string *)
                                                ((long)(this_01->
                                                                                                              
                                                  super__Vector_base<nivalis::SliderData,_std::allocator<nivalis::SliderData>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                lVar14));
              *(float *)((long)(this_01->
                               super__Vector_base<nivalis::SliderData,_std::allocator<nivalis::SliderData>_>
                               )._M_impl.super__Vector_impl_data._M_start + lVar14 + 0x20) =
                   (float)dVar18;
            }
          }
        }
        nlohmann::detail::
        iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::operator++((iterator *)&ss);
      }
    }
  }
  sVar8 = nlohmann::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
          ::count<char_const(&)[6]>
                    ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      *)&j,(char (*) [6])0x20c92e);
  if (sVar8 != 0) {
    pvVar9 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         *)&j,"funcs");
    if (pvVar9->m_type == array) {
      pvVar9 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                           *)&j,"funcs");
      lVar14 = 0x50;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::begin(&__end3,pvVar9);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::end(&__end3_2,pvVar9);
      sVar15 = 1;
      while( true ) {
        bVar4 = nlohmann::detail::
                iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator!=(&__end3,&__end3_2);
        if (!bVar4) break;
        pbVar10 = nlohmann::detail::
                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::operator*(&__end3);
        std::vector<nivalis::Function,_std::allocator<nivalis::Function>_>::emplace_back<>(this_00);
        pFVar17 = (this_00->
                  super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>)._M_impl
                  .super__Vector_impl_data._M_start;
        this_03 = (string *)((long)(pFVar17->line_color).data + lVar14 + -0x70);
        if (pbVar10->m_type == string) {
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::
          get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                     pbVar10);
          std::__cxx11::string::operator=
                    ((string *)((long)(pFVar17->line_color).data + lVar14 + -0x20),(string *)&ss);
          std::__cxx11::string::~string((string *)&ss);
          uVar1 = this->next_func_name;
          this->next_func_name = uVar1 + 1;
          std::__cxx11::to_string((string *)&__begin3,uVar1);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                         "f",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &__begin3);
          std::__cxx11::string::operator=(this_03,(string *)&ss);
          std::__cxx11::string::~string((string *)&ss);
          std::__cxx11::string::~string((string *)&__begin3);
          color::from_int((color *)&ss,sVar15 - 1);
          color::color::operator=
                    ((color *)&__begin3,(color *)((long)(pFVar17->line_color).data + lVar14 + -0x50)
                     ,(color *)&ss);
          this->last_expr_color = sVar15;
        }
        else if (pbVar10->m_type == object) {
          sVar8 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::count<char_const(&)[5]>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              *)pbVar10,(char (*) [5])"expr");
          if (sVar8 != 0) {
            pvVar9 = nlohmann::
                     basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                     ::operator[]<char_const>
                               ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                 *)pbVar10,"expr");
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::
            get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                       pvVar9);
            std::__cxx11::string::operator=
                      ((string *)((long)(pFVar17->line_color).data + lVar14 + -0x20),(string *)&ss);
            std::__cxx11::string::~string((string *)&ss);
          }
          sVar8 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::count<char_const(&)[6]>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              *)pbVar10,(char (*) [6])0x20beb6);
          if (sVar8 == 0) {
            color::from_int((color *)&ss,sVar15 - 1);
            color::color::operator=
                      ((color *)&__begin3,
                       (color *)((long)(pFVar17->line_color).data + lVar14 + -0x50),(color *)&ss);
            this->last_expr_color = sVar15;
          }
          else {
            pvVar9 = nlohmann::
                     basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                     ::operator[]<char_const>
                               ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                 *)pbVar10,"color");
            if (pvVar9->m_type == string) {
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::
              get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &tmpshell,pvVar9);
              color::from_hex((color *)&ss,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &tmpshell);
              color::color::operator=
                        ((color *)&__begin3,
                         (color *)((long)(pFVar17->line_color).data + lVar14 + -0x50),(color *)&ss);
              std::__cxx11::string::~string((string *)&tmpshell);
            }
            else if ((byte)(pvVar9->m_type - number_integer) < 2) {
              iVar5 = nlohmann::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      ::get<int,_int,_0>(pvVar9);
              color::from_int((color *)&ss,(long)iVar5);
              color::color::operator=
                        ((color *)&__begin3,
                         (color *)((long)(pFVar17->line_color).data + lVar14 + -0x50),(color *)&ss);
            }
          }
          sVar8 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::count<char_const(&)[3]>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              *)pbVar10,(char (*) [3])0x2461fb);
          if (sVar8 == 0) {
            uVar1 = this->next_func_name;
            this->next_func_name = uVar1 + 1;
            std::__cxx11::to_string((string *)&__begin3,uVar1);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                           "f",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &__begin3);
          }
          else {
            pvVar9 = nlohmann::
                     basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                     ::operator[]<char_const>
                               ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                 *)pbVar10,"id");
            iVar5 = nlohmann::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ::get<int,_int,_0>(pvVar9);
            uVar16 = (long)iVar5 + 1U;
            if ((long)iVar5 + 1U < this->next_func_name) {
              uVar16 = this->next_func_name;
            }
            this->next_func_name = uVar16;
            std::__cxx11::to_string((string *)&__begin3,iVar5);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                           "f",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &__begin3);
          }
          std::__cxx11::string::operator=(this_03,(string *)&ss);
          std::__cxx11::string::~string((string *)&ss);
          std::__cxx11::string::~string((string *)&__begin3);
          sVar8 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::count<char_const(&)[5]>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              *)pbVar10,(char (*) [5])0x1e22d7);
          if (sVar8 != 0) {
            pvVar9 = nlohmann::
                     basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                     ::operator[]<char_const>
                               ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                 *)pbVar10,"tmin");
            dVar18 = nlohmann::
                     basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     ::get<double,_double,_0>(pvVar9);
            *(float *)((long)(pFVar17->line_color).data + lVar14 + 4) = (float)dVar18;
          }
          sVar8 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::count<char_const(&)[5]>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              *)pbVar10,(char (*) [5])0x1e22ec);
          if (sVar8 != 0) {
            pvVar9 = nlohmann::
                     basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                     ::operator[]<char_const>
                               ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                 *)pbVar10,"tmax");
            dVar18 = nlohmann::
                     basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     ::get<double,_double,_0>(pvVar9);
            *(float *)((long)(pFVar17->line_color).data + lVar14 + 8) = (float)dVar18;
          }
        }
        lVar14 = lVar14 + 0x130;
        sVar15 = sVar15 + 1;
        nlohmann::detail::
        iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::operator++(&__end3);
      }
      goto LAB_001294f7;
    }
  }
  std::vector<nivalis::Function,_std::allocator<nivalis::Function>_>::resize(this_00,1);
  std::__cxx11::string::assign
            ((char *)&((this_00->
                       super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>).
                       _M_impl.super__Vector_impl_data._M_start)->expr_str);
  ((this->funcs).super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>._M_impl.
   super__Vector_impl_data._M_start)->type = 0;
  sVar15 = this->last_expr_color;
  this->last_expr_color = sVar15 + 1;
  color::from_int((color *)&ss,sVar15);
  color::color::operator=
            ((color *)&__begin3,
             &((this_00->super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>).
               _M_impl.super__Vector_impl_data._M_start)->line_color,(color *)&ss);
  uVar1 = this->next_func_name;
  this->next_func_name = uVar1 + 1;
  std::__cxx11::to_string((string *)&__begin3,uVar1);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,"f",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__begin3);
  std::__cxx11::string::operator=
            ((string *)
             (this_00->super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>).
             _M_impl.super__Vector_impl_data._M_start,(string *)&ss);
  std::__cxx11::string::~string((string *)&ss);
  std::__cxx11::string::~string((string *)&__begin3);
LAB_001294f7:
  std::deque<nivalis::color::color,_std::allocator<nivalis::color::color>_>::clear
            (&this->reuse_colors);
  sVar8 = nlohmann::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
          ::count<char_const(&)[9]>
                    ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      *)&j,(char (*) [9])"internal");
  if (sVar8 != 0) {
    pvVar9 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         *)&j,"internal");
    if (pvVar9->m_type == object) {
      sVar8 = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ::count<char_const(&)[10]>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                          *)pvVar9,(char (*) [10])"curr_func");
      if (sVar8 == 0) {
        set_curr_func(this,0);
      }
      else {
        pvVar12 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              *)pvVar9,"curr_func");
        uVar6 = nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::get<int,_int,_0>(pvVar12);
        if (((int)uVar6 < 0) ||
           (sVar15 = (size_t)uVar6,
           (ulong)(((long)(this->funcs).
                          super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->funcs).
                         super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>.
                         _M_impl.super__Vector_impl_data._M_start) / 0x130) <= sVar15)) {
          sVar15 = 0;
        }
        set_curr_func(this,sVar15);
      }
      sVar8 = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ::count<char_const(&)[11]>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                          *)pvVar9,(char (*) [11])"next_color");
      if (sVar8 != 0) {
        pvVar12 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              *)pvVar9,"next_color");
        dVar18 = nlohmann::
                 basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::get<double,_double,_0>(pvVar12);
        this->last_expr_color =
             (long)(dVar18 - 9.223372036854776e+18) & (long)dVar18 >> 0x3f | (long)dVar18;
      }
      sVar8 = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ::count<char_const(&)[12]>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                          *)pvVar9,(char (*) [12])"color_queue");
      if (sVar8 != 0) {
        pvVar12 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              *)pvVar9,"color_queue");
        if (pvVar12->m_type == array) {
          pvVar9 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                               *)pvVar9,"color_queue");
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::begin(&__begin3,pvVar9);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::end(&__end3,pvVar9);
          while( true ) {
            bVar4 = nlohmann::detail::
                    iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ::operator!=(&__begin3,&__end3);
            if (!bVar4) break;
            pbVar10 = nlohmann::detail::
                      iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ::operator*(&__begin3);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::
            get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &__end3_2,pbVar10);
            color::from_hex((color *)&ss,(string *)&__end3_2);
            std::deque<nivalis::color::color,_std::allocator<nivalis::color::color>_>::
            emplace_back<nivalis::color::color>(&this->reuse_colors,(color *)&ss);
            std::__cxx11::string::~string((string *)&__end3_2);
            nlohmann::detail::
            iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::operator++(&__begin3);
          }
        }
      }
    }
  }
  sVar8 = nlohmann::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
          ::count<char_const(&)[6]>
                    ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      *)&j,(char (*) [6])0x21cbec);
  if (sVar8 == 0) {
    bVar4 = false;
  }
  else {
    pvVar9 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         *)&j,"latex");
    bVar4 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::get<bool,_bool,_0>(pvVar9);
  }
  if (bVar4 != this->use_latex) {
    lVar14 = 0x50;
    uVar16 = 0;
    if (this->use_latex == false) {
      for (; pFVar17 = (this->funcs).
                       super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>.
                       _M_impl.super__Vector_impl_data._M_start,
          uVar16 < (ulong)(((long)(this->funcs).
                                  super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar17) /
                          0x130); uVar16 = uVar16 + 1) {
        latex_to_nivalis((string *)&ss,(string *)((long)(pFVar17->line_color).data + lVar14 + -0x20)
                        );
        std::__cxx11::string::operator=
                  ((string *)
                   ((long)(((this_00->
                            super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>
                            )._M_impl.super__Vector_impl_data._M_start)->line_color).data +
                   lVar14 + -0x20),(string *)&ss);
        std::__cxx11::string::~string((string *)&ss);
        lVar14 = lVar14 + 0x130;
      }
    }
    else {
      for (; pFVar17 = (this->funcs).
                       super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>.
                       _M_impl.super__Vector_impl_data._M_start,
          uVar16 < (ulong)(((long)(this->funcs).
                                  super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar17) /
                          0x130); uVar16 = uVar16 + 1) {
        nivalis_to_latex_safe
                  ((string *)&ss,(string *)((long)(pFVar17->line_color).data + lVar14 + -0x20));
        std::__cxx11::string::operator=
                  ((string *)
                   ((long)(((this_00->
                            super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>
                            )._M_impl.super__Vector_impl_data._M_start)->line_color).data +
                   lVar14 + -0x20),(string *)&ss);
        std::__cxx11::string::~string((string *)&ss);
        lVar14 = lVar14 + 0x130;
      }
    }
  }
  uVar16 = 0;
  while( true ) {
    pFVar17 = (this->funcs).
              super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>._M_impl.
              super__Vector_impl_data._M_start;
    pFVar13 = (this->funcs).
              super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if ((ulong)(((long)pFVar13 - (long)pFVar17) / 0x130) <= uVar16) break;
    reparse_expr(this,uVar16);
    uVar16 = uVar16 + 1;
  }
  for (uVar16 = 0; uVar16 < (ulong)(((long)pFVar13 - (long)pFVar17) / 0x130); uVar16 = uVar16 + 1) {
    reparse_expr(this,uVar16);
    pFVar17 = (this->funcs).
              super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>._M_impl.
              super__Vector_impl_data._M_start;
    pFVar13 = (this->funcs).
              super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>._M_impl.
              super__Vector_impl_data._M_finish;
  }
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&j);
  return is;
}

Assistant:

std::istream& Plotter::import_json(std::istream& is, std::string* error_msg) {
    if (error_msg) {
        error_msg->clear();
    }
    try {
        funcs.clear();

        json j; is >> j;
        if (j.is_array()) {
            // Interpret as function list
            j = json {
                {"funcs",  j}
            };
        }

        {
            // Load environment
            env.clear();
            x_var = env.addr_of("x", false);
            y_var = env.addr_of("y", false);
            t_var = env.addr_of("t", false);
            r_var = env.addr_of("r", false);
            std::ostringstream ss;
            Shell tmpshell(env, ss);
            if (j.count("shell") && j["shell"].is_array()) {
                for (auto& line : j["shell"]) {
                    if (line.is_string()) {
                        if (!tmpshell.eval_line(line.get<std::string>())) {
                            std::cout << "json_load_err " << ss.str() << "\n";
                        }
                    }
                }
            }
        }

        // Load view
        // Defaults
        polar_grid = false;
        enable_axes = enable_grid = true;
        if (j.count("view")) {
            json& jview = j["view"];
            if (jview.is_object()) {
                if (jview.count("xmin")) view.xmin = jview["xmin"].get<double>();
                if (jview.count("xmax")) view.xmax = jview["xmax"].get<double>();
                if (jview.count("xmin")) view.ymin = jview["ymin"].get<double>();
                if (jview.count("xmax")) view.ymax = jview["ymax"].get<double>();
                int old_swid = view.swid, old_shigh = view.shigh;
                if (jview.count("width")) view.swid = jview["width"].get<double>();
                if (jview.count("height")) view.shigh = jview["height"].get<double>();
                // Will resize bounds to fit screen
                // else will become too distorted
                resize(old_swid, old_shigh);
                if (jview.count("axes")) enable_axes = jview["axes"].get<bool>();
                if (jview.count("grid")) enable_grid = jview["grid"].get<bool>();
                if (jview.count("polar")) polar_grid = jview["polar"].get<bool>();
            }
        }

        // Load sliders
        sliders.clear();
        sliders_vars.clear();

        if (j.count("sliders") && j["sliders"].is_array()) {
            for (auto& slider : j["sliders"]) {
                if (!slider.is_object()) continue;
                size_t idx = sliders.size();
                sliders.emplace_back();
                if (slider.count("min"))
                    sliders[idx].lo = slider["min"].get<double>();
                if (slider.count("max"))
                    sliders[idx].hi = slider["max"].get<double>();
                if (slider.count("val")) {
                    sliders[idx].val = slider["val"].get<double>();
                }
                if (slider.count("var")) {
                    sliders[idx].var_name = slider["var"].get<std::string>();
                    update_slider_var(idx);
                    if (!slider.count("val")) {
                        sliders[idx].val = env.get(sliders[idx].var_name);
                    }
                }
            }
        }
        if (j.count("funcs") && j["funcs"].is_array()) {
            size_t idx = 0;
            for (auto& jfunc : j["funcs"]) {
                funcs.emplace_back();
                auto& f = funcs[idx];
                if (jfunc.is_object()) {
                    // Object form
                    if (jfunc.count("expr"))
                        f.expr_str = jfunc["expr"].get<std::string>();
                    if (jfunc.count("color")) {
                        auto& jcol = jfunc["color"];
                        if (jcol.is_string()) {
                            f.line_color = color::from_hex(
                                    jcol.get<std::string>());
                        } else if (jcol.is_number_integer()) {
                            f.line_color = color::from_int(
                                    (size_t)jcol.get<int>());
                        }
                    } else {
                        f.line_color = color::from_int(idx);
                        last_expr_color = idx+1;
                    }
                    if (jfunc.count("id")) {
                        int id = jfunc["id"].get<int>();
                        next_func_name = std::max(next_func_name, (size_t)id+1);
                        f.name = "f" + std::to_string(id);
                    } else {
                        f.name = "f" + std::to_string(next_func_name++);
                    }
                    if (jfunc.count("tmin")) {
                        f.tmin = jfunc["tmin"].get<double>();
                    }
                    if (jfunc.count("tmax")) {
                        f.tmax = jfunc["tmax"].get<double>();
                    }
                } else if (jfunc.is_string()) {
                    // Only expression
                    f.expr_str = jfunc.get<std::string>();
                    f.name = "f" + std::to_string(next_func_name++);
                    f.line_color = color::from_int(idx);
                    last_expr_color = idx+1;
                }
                ++idx;
            }
        } else {
            // Ensure there is at lease 1 function left
            funcs.resize(1);
            funcs[0].expr_str = "";
            funcs[0].type = Function::FUNC_TYPE_EXPLICIT;
            funcs[0].line_color = color::from_int(last_expr_color++);
            funcs[0].name = "f" + std::to_string(next_func_name++);
        }

        reuse_colors.clear();
        if (j.count("internal")) {
            json& jint = j["internal"];
            if (jint.is_object()) {
                if (jint.count("curr_func")) {
                    int cf = jint["curr_func"].get<int>();
                    if (cf < 0 || cf >= funcs.size()) {
                        set_curr_func(0);
                    } else {
                        set_curr_func(cf);
                    }
                } else {
                    set_curr_func(0);
                }
                if (jint.count("next_color")) last_expr_color =
                    jint["next_color"].get<double>();
                if (jint.count("color_queue") &&
                        jint["color_queue"].is_array()) {
                    for (auto& jcol : jint["color_queue"]) {
                        reuse_colors.push_back(color::from_hex(
                                    jcol.get<std::string>()));
                    }
                }
            }
        }
        bool imp_use_latex = false;
        if (j.count("latex")) {
            imp_use_latex = j["latex"].get<bool>() == true;
        }
        // If one save uses Nivalis expression format and the other uses LaTeX, try to convert
        if (imp_use_latex != use_latex) {
            if (use_latex) {
                for (size_t i = 0; i < funcs.size(); ++i) {
                    funcs[i].expr_str = nivalis_to_latex_safe(funcs[i].expr_str);
                }
            } else {
                for (size_t i = 0; i < funcs.size(); ++i) {
                    funcs[i].expr_str = latex_to_nivalis(funcs[i].expr_str);
                }
            }
        }
        for (size_t i = 0; i < funcs.size(); ++i) {
            reparse_expr(i);
        }
        for (size_t i = 0; i < funcs.size(); ++i) {
            // Reparse again in case of reference to other functions
            reparse_expr(i);
        }
    } catch (const json::parse_error& e) {
        if (error_msg != nullptr) {
            *error_msg = e.what();
        }
    }
    return is;
}